

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# betti.h
# Opt level: O0

void print_ordinary(ostream *outstream,int min_dimension,int max_dimension,int top_dimension,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *number_of_cells,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *betti,
                   vector<unsigned_long,_std::allocator<unsigned_long>_> *skipped,
                   bool approximate_computation,bool with_cell_counts)

{
  ulong uVar1;
  unsigned_short uVar2;
  int iVar3;
  ostream *poVar4;
  int *piVar5;
  reference pvVar6;
  void *this;
  size_type sVar7;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  char *pcVar8;
  ostream *in_RDI;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_00000008;
  byte in_stack_00000010;
  byte in_stack_00000018;
  size_t idx_1;
  size_t idx;
  bool computed_full_homology;
  int i_1;
  index_t cell_euler_characteristic;
  int i;
  bool local_b1;
  ulong local_70;
  int local_68 [2];
  ulong local_60;
  int local_54 [2];
  bool local_49;
  int local_48;
  int local_44;
  int local_40 [3];
  int local_34 [2];
  byte local_2a;
  byte local_29;
  int local_14;
  uint local_10;
  int local_c;
  ostream *local_8;
  
  local_29 = in_stack_00000010 & 1;
  local_2a = in_stack_00000018 & 1;
  local_c = in_ESI;
  local_8 = in_RDI;
  if (local_2a != 0) {
    local_14 = in_ECX;
    local_10 = in_EDX;
    poVar4 = std::operator<<(in_RDI,"# Cell counts (of dimensions between ");
    local_34[1] = 0;
    local_34[0] = local_c + -1;
    piVar5 = std::max<int>(local_34 + 1,local_34);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
    poVar4 = std::operator<<(poVar4," and ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_14);
    poVar4 = std::operator<<(poVar4,"):");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_40[1] = 0;
    local_40[0] = local_c + -1;
    piVar5 = std::max<int>(local_40 + 1,local_40);
    for (local_40[2] = *piVar5; poVar4 = local_8, local_40[2] <= local_14;
        local_40[2] = local_40[2] + 1) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_R8,(long)local_40[2]);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar6);
      pcVar8 = "";
      if (local_40[2] < local_14) {
        pcVar8 = " ";
      }
      std::operator<<(poVar4,pcVar8);
    }
    std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
    local_44 = 0;
    for (local_48 = 0; local_48 <= local_14; local_48 = local_48 + 1) {
      iVar3 = 1;
      if (local_48 % 2 == 1) {
        iVar3 = -1;
      }
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_R8,(long)local_48);
      local_44 = iVar3 * (int)*pvVar6 + local_44;
    }
    local_b1 = false;
    if (local_c == 0) {
      uVar2 = std::numeric_limits<unsigned_short>::max();
      local_b1 = local_10 == uVar2;
    }
    local_49 = local_b1;
    if (local_b1 != false) {
      poVar4 = std::operator<<(local_8,"# Euler characteristic:");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
      this = (void *)std::ostream::operator<<(local_8,local_44);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    }
  }
  if ((local_29 & 1) != 0) {
    poVar4 = std::operator<<(local_8,
                             "# Skipped columns of the coboundary matrix (in dimensions between ");
    local_54[1] = 0;
    local_54[0] = local_c + -1;
    piVar5 = std::max<int>(local_54 + 1,local_54);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*piVar5);
    poVar4 = std::operator<<(poVar4," and ");
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_stack_00000008);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar7 - 1);
    poVar4 = std::operator<<(poVar4,"):");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    local_68[1] = 0;
    local_68[0] = local_c + -1;
    piVar5 = std::max<int>(local_68 + 1,local_68);
    for (local_60 = (ulong)*piVar5; uVar1 = local_60,
        sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_stack_00000008),
        poVar4 = local_8, uVar1 < sVar7; local_60 = local_60 + 1) {
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_00000008,local_60);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar6);
      uVar1 = local_60;
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_R9);
      pcVar8 = "";
      if (uVar1 < sVar7) {
        pcVar8 = " ";
      }
      std::operator<<(poVar4,pcVar8);
    }
    std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  }
  poVar4 = std::operator<<(local_8,"# Betti numbers (between ");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_c);
  poVar4 = std::operator<<(poVar4," and ");
  sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_R9);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar7 - 1);
  poVar4 = std::operator<<(poVar4,"):");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  for (local_70 = (ulong)local_c;
      sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_R9),
      poVar4 = local_8, local_70 < sVar7; local_70 = local_70 + 1) {
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_R9,local_70);
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar6);
    sVar7 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_R9);
    pcVar8 = "";
    if (local_70 < sVar7) {
      pcVar8 = " ";
    }
    std::operator<<(poVar4,pcVar8);
  }
  std::ostream::operator<<(local_8,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print_ordinary(std::ostream& outstream, int min_dimension, int max_dimension, int top_dimension,
                    std::vector<size_t> number_of_cells, std::vector<size_t> betti, std::vector<size_t> skipped,
                    bool approximate_computation, bool with_cell_counts) {
	if (with_cell_counts) {
		outstream << "# Cell counts (of dimensions between " << std::max(0, min_dimension - 1) << " and "
		          << top_dimension << "):" << std::endl;
		for (int i = std::max(0, min_dimension - 1); i <= top_dimension; i++)
			outstream << number_of_cells[i] << (i < top_dimension ? " " : "");
		outstream << std::endl;

		index_t cell_euler_characteristic = 0;
		for (int i = 0; i <= top_dimension; i++)
			cell_euler_characteristic += index_t((i % 2 == 1 ? -1 : 1) * number_of_cells[i]);

		bool computed_full_homology = min_dimension == 0 && max_dimension == std::numeric_limits<unsigned short>::max();
		if (computed_full_homology) {
			outstream << "# Euler characteristic:" << std::endl;
			outstream << cell_euler_characteristic << std::endl;
		}
	}

	if (approximate_computation) {
		outstream << "# Skipped columns of the coboundary matrix (in dimensions between "
		          << std::max(0, min_dimension - 1) << " and " << skipped.size() - 1 << "):" << std::endl;
		for (size_t idx = std::max(0, min_dimension - 1); idx < skipped.size(); idx++) {
			outstream << skipped[idx] << (idx < betti.size() ? " " : "");
		}
		outstream << std::endl;
	}

	outstream << "# Betti numbers (between " << min_dimension << " and " << (betti.size() - 1) << "):" << std::endl;
	for (size_t idx = min_dimension; idx < betti.size(); idx++) {
		outstream << betti[idx] << (idx < betti.size() ? " " : "");
	}

	outstream << std::endl;
}